

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_fill_random
              (mbedtls_mpi *X,size_t size,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi_uint *pmVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong *puVar6;
  ulong *puVar7;
  size_t nblimbs;
  
  nblimbs = ((size >> 3) + 1) - (ulong)((size & 7) == 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
    iVar5 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  iVar5 = mbedtls_mpi_grow(X,1);
  if (iVar5 == 0) {
    iVar5 = 0;
    memset(X->p,0,X->n << 3);
    pmVar1 = X->p;
    *pmVar1 = 0;
    X->s = 1;
    (*f_rng)(p_rng,(uchar *)((nblimbs * 8 - size) + (long)pmVar1),size);
    puVar2 = X->p;
    puVar7 = puVar2 + (nblimbs - 1);
    if (puVar2 <= puVar7 && nblimbs != 0) {
      do {
        puVar6 = puVar2 + 1;
        uVar3 = *puVar2;
        uVar4 = *puVar7;
        *puVar2 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                  (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                  (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                  | uVar4 << 0x38;
        *puVar7 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                  | uVar3 << 0x38;
        puVar7 = puVar7 + -1;
        puVar2 = puVar6;
      } while (puVar6 <= puVar7);
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_fill_random( mbedtls_mpi *X, size_t size,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t const limbs = CHARS_TO_LIMBS( size );
    size_t const overhead = ( limbs * ciL ) - size;
    unsigned char *Xp;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    Xp = (unsigned char*) X->p;
    f_rng( p_rng, Xp + overhead, size );

    mpi_bigendian_to_host( X->p, limbs );

cleanup:
    return( ret );
}